

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::SquaredEuclideanDistance::ByteSizeLong(SquaredEuclideanDistance *this)

{
  this->_cached_size_ = 0;
  return 0;
}

Assistant:

size_t SquaredEuclideanDistance::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SquaredEuclideanDistance)
  size_t total_size = 0;

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}